

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.h
# Opt level: O1

bool spvtools::opt::analysis::operator==(TargetData *lhs,TargetData *rhs)

{
  bool bVar1;
  
  bVar1 = std::
          __is_permutation<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    ((lhs->direct_decorations).
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (lhs->direct_decorations).
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (rhs->direct_decorations).
                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    bVar1 = std::
            __is_permutation<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      ((lhs->indirect_decorations).
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (lhs->indirect_decorations).
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (rhs->indirect_decorations).
                       super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    if (bVar1) {
      bVar1 = std::
              __is_permutation<__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__normal_iterator<spvtools::opt::Instruction*const*,std::vector<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        ((lhs->decorate_insts).
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (lhs->decorate_insts).
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (rhs->decorate_insts).
                         super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool operator==(const TargetData& lhs, const TargetData& rhs) {
    if (!std::is_permutation(lhs.direct_decorations.begin(),
                             lhs.direct_decorations.end(),
                             rhs.direct_decorations.begin())) {
      return false;
    }
    if (!std::is_permutation(lhs.indirect_decorations.begin(),
                             lhs.indirect_decorations.end(),
                             rhs.indirect_decorations.begin())) {
      return false;
    }
    if (!std::is_permutation(lhs.decorate_insts.begin(),
                             lhs.decorate_insts.end(),
                             rhs.decorate_insts.begin())) {
      return false;
    }
    return true;
  }